

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

uint64_t __thiscall r_exec::Group::get_next_upr_time(Group *this,uint64_t now)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  uint64_t delta;
  uint64_t _upr;
  uint64_t __upr;
  uint64_t now_local;
  Group *this_local;
  
  uVar1 = get_upr(this);
  if ((ulong)uVar1 == 0) {
    this_local = (Group *)0xffffffffffffffff;
  }
  else {
    lVar2 = r_code::Utils::GetBasePeriod();
    uVar3 = (ulong)uVar1 * lVar2;
    lVar2 = r_code::Utils::GetTimeReference();
    this_local = (Group *)((now - (now - lVar2) % uVar3) + uVar3);
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Group::get_next_upr_time(uint64_t now) const
{
    uint64_t __upr = get_upr();

    if (__upr == 0) {
        return Utils::MaxTime;
    }

    uint64_t _upr = __upr * Utils::GetBasePeriod();
    uint64_t delta = (now - Utils::GetTimeReference()) % _upr;
    return now - delta + _upr;
}